

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::invalidateBackingStore<QRegion>(QWidgetPrivate *this,QRegion *r)

{
  long lVar1;
  QWidget *this_00;
  long lVar2;
  QWExtra *pQVar3;
  char cVar4;
  QWidget *pQVar5;
  long in_FS_OFFSET;
  QRegion masked;
  undefined8 local_48;
  QRegion clipped;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar4 = QRegion::isEmpty();
  if (((cVar4 == '\0') && (cVar4 = QCoreApplication::closingDown(), cVar4 == '\0')) &&
     (this_00 = *(QWidget **)&this->field_0x8, (this_00->data->widget_attributes & 0x8400) == 0x8000
     )) {
    pQVar5 = QWidget::window(this_00);
    lVar2 = *(long *)(*(long *)&pQVar5->field_0x8 + 0x78);
    if (((lVar2 != 0) && (lVar2 = *(long *)(lVar2 + 8), lVar2 != 0)) &&
       ((*(long *)(lVar2 + 0x10) != 0 && (*(long *)(lVar2 + 8) != 0)))) {
      clipped.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&clipped,r);
      _masked = clipRect(this);
      QRegion::operator&=(&clipped,(QRect *)&masked);
      cVar4 = QRegion::isEmpty();
      if (cVar4 == '\0') {
        if (((this->graphicsEffect == (QGraphicsEffect *)0x0) &&
            (pQVar3 = (this->extra)._M_t.
                      super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                      super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                      super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl, pQVar3 != (QWExtra *)0x0
            )) && ((pQVar3->field_0x7c & 0x80) != 0)) {
          masked.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion(&masked,&pQVar3->mask);
          QRegion::operator&=(&masked,&clipped);
          cVar4 = QRegion::isEmpty();
          if (cVar4 == '\0') {
            QWidgetRepaintManager::markDirty<QRegion>
                      (*(QWidgetRepaintManager **)(lVar2 + 8),&masked,this_00,UpdateLater,
                       BufferInvalid);
          }
          QRegion::~QRegion(&masked);
        }
        else {
          QWidgetRepaintManager::markDirty<QRegion>
                    (*(QWidgetRepaintManager **)(lVar2 + 8),&clipped,this_00,UpdateLater,
                     BufferInvalid);
        }
      }
      QRegion::~QRegion(&clipped);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::invalidateBackingStore(const T &r)
{
    if (r.isEmpty())
        return;

    if (QCoreApplication::closingDown())
        return;

    Q_Q(QWidget);
    if (!q->isVisible() || !q->updatesEnabled())
        return;

    QTLWExtra *tlwExtra = q->window()->d_func()->maybeTopData();
    if (!tlwExtra || !tlwExtra->backingStore || !tlwExtra->repaintManager)
        return;

    T clipped(r);
    clipped &= clipRect();
    if (clipped.isEmpty())
        return;

    if (!graphicsEffect && extra && extra->hasMask) {
        QRegion masked(extra->mask);
        masked &= clipped;
        if (masked.isEmpty())
            return;

        tlwExtra->repaintManager->markDirty(masked, q,
            QWidgetRepaintManager::UpdateLater, QWidgetRepaintManager::BufferInvalid);
    } else {
        tlwExtra->repaintManager->markDirty(clipped, q,
            QWidgetRepaintManager::UpdateLater, QWidgetRepaintManager::BufferInvalid);
    }
}